

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

bool arangodb::velocypack::Collection::contains(Slice slice,Slice other)

{
  bool bVar1;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RSI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  ArrayIterator it;
  Slice in_stack_ffffffffffffffc8;
  Slice in_stack_ffffffffffffffd0;
  
  ArrayIterator::ArrayIterator
            ((ArrayIterator *)in_stack_ffffffffffffffc8._start,in_stack_ffffffffffffffd0);
  while( true ) {
    bVar1 = ArrayIterator::valid((ArrayIterator *)&stack0xffffffffffffffc8);
    if (!bVar1) {
      return false;
    }
    ArrayIterator::value((ArrayIterator *)in_stack_ffffffffffffffc8._start);
    bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
            binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>(in_RDI,in_RSI);
    if (bVar1) break;
    ArrayIterator::next((ArrayIterator *)in_stack_ffffffffffffffd0._start);
  }
  return true;
}

Assistant:

bool Collection::contains(Slice slice, Slice other) {
  ArrayIterator it(slice);

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return true;
    }
    it.next();
  }

  return false;
}